

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.hpp
# Opt level: O0

void __thiscall deqp::gls::LineStream::LineStream(LineStream *this,int indent)

{
  int indent_local;
  LineStream *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream);
  std::__cxx11::string::string((string *)&this->m_string);
  this->m_indent = indent;
  return;
}

Assistant:

LineStream		(int indent = 0)	{ m_indent = indent; }